

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExpression *
build_ir_constructor(Context_conflict *ctx,MOJOSHADER_astExpressionConstructor *ast)

{
  MOJOSHADER_astDataTypeType MVar1;
  int iVar2;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar3;
  MOJOSHADER_irExprList *pMVar4;
  MOJOSHADER_irExpression *pMVar5;
  
  dt = reduce_datatype(ctx,ast->datatype);
  pMVar3 = datatype_base(ctx,dt);
  MVar1 = pMVar3->type;
  iVar2 = datatype_elems(ctx,dt);
  if (iVar2 < 0x11) {
    pMVar4 = build_ir_exprlist(ctx,ast->args);
    pMVar5 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pMVar5 == (MOJOSHADER_irExpression *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar5 = (MOJOSHADER_irExpression *)0x0;
    }
    else {
      (pMVar5->ir).type = MOJOSHADER_IR_CONSTRUCT;
      (pMVar5->ir).filename = ctx->sourcefile;
      (pMVar5->ir).line = ctx->sourceline;
      (pMVar5->info).type = MVar1;
      (pMVar5->info).elements = iVar2;
      (pMVar5->construct).args = pMVar4;
    }
    return pMVar5;
  }
  __assert_fail("elems <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1498,
                "MOJOSHADER_irExpression *build_ir_constructor(Context *, const MOJOSHADER_astExpressionConstructor *)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_constructor(Context *ctx, const MOJOSHADER_astExpressionConstructor *ast)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    assert(elems <= 16);  // just in case (matrix4x4 constructor is largest).
    return new_ir_construct(ctx, build_ir_exprlist(ctx, ast->args), type, elems);
}